

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

void __thiscall
util::ConstevalFormatString<0U>::Detail_CheckNumFormatSpecifiers
          (ConstevalFormatString<0U> *this,string_view str)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  undefined8 *puVar4;
  uint uVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  uint uVar11;
  long in_FS_OFFSET;
  
  pbVar7 = (byte *)str._M_str;
  pbVar9 = (byte *)str._M_len;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)this < 1) {
    iVar3 = 0;
    uVar5 = 0;
  }
  else {
    pbVar10 = pbVar9 + (long)&this->fmt;
    iVar3 = 0;
    uVar5 = 0;
    do {
      while (pbVar7 = pbVar9 + 1, *pbVar9 == 0x25) {
        if (pbVar10 <= pbVar7) {
LAB_006de3cc:
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_006de444;
          puVar4 = (undefined8 *)__cxa_allocate_exception(8);
          pcVar6 = "Format specifier incorrectly terminated by end of string";
          goto LAB_006de3ec;
        }
        bVar1 = *pbVar7;
        pbVar7 = (byte *)CONCAT71((int7)((ulong)pbVar7 >> 8),bVar1);
        if (bVar1 == 0x25) {
          pbVar7 = pbVar9 + 2;
          break;
        }
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar11 = 0;
          pbVar9 = pbVar9 + 2;
          do {
            pbVar8 = pbVar9;
            uVar11 = (((uint)pbVar7 & 0xff) + uVar11 * 10) - 0x30;
            bVar1 = *pbVar8;
            pbVar7 = (byte *)(ulong)bVar1;
            pbVar9 = pbVar8 + 1;
          } while ((byte)(bVar1 - 0x30) < 10);
          if (bVar1 != 0x24) {
            pbVar9 = pbVar8 + -1;
            goto LAB_006de376;
          }
          if (uVar11 == 0) goto LAB_006de422;
          if (uVar11 < uVar5) {
            uVar11 = uVar5;
          }
          uVar5 = uVar11;
          if (pbVar10 <= pbVar9) goto LAB_006de3cc;
        }
        else {
          if (bVar1 == 0x24) {
LAB_006de422:
            if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_006de444;
            puVar4 = (undefined8 *)__cxa_allocate_exception(8);
            pcVar6 = "Positional format specifier must have position of at least 1";
            goto LAB_006de3ec;
          }
LAB_006de376:
          iVar3 = iVar3 + 1;
          pbVar9 = pbVar9 + 2;
        }
        if (pbVar10 <= pbVar9) goto LAB_006de385;
      }
      pbVar9 = pbVar7;
    } while (pbVar7 < pbVar10);
LAB_006de385:
    if ((iVar3 != 0) && (uVar5 != 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar6 = "Format specifiers must be all positional or all non-positional!";
        goto LAB_006de3ec;
      }
      goto LAB_006de444;
    }
  }
  if (iVar3 == 0 && uVar5 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8,pbVar9,pbVar7);
    pcVar6 = "Format specifier count must match the argument count!";
LAB_006de3ec:
    *puVar4 = pcVar6;
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
LAB_006de444:
  __stack_chk_fail();
}

Assistant:

constexpr static void Detail_CheckNumFormatSpecifiers(std::string_view str)
    {
        unsigned count_normal{0}; // Number of "normal" specifiers, like %s
        unsigned count_pos{0};    // Max number in positional specifier, like %8$s
        for (auto it{str.begin()}; it < str.end();) {
            if (*it != '%') {
                ++it;
                continue;
            }

            if (++it >= str.end()) throw "Format specifier incorrectly terminated by end of string";
            if (*it == '%') {
                // Percent escape: %%
                ++it;
                continue;
            }

            unsigned maybe_num{0};
            while ('0' <= *it && *it <= '9') {
                maybe_num *= 10;
                maybe_num += *it - '0';
                ++it;
            };

            if (*it == '$') {
                // Positional specifier, like %8$s
                if (maybe_num == 0) throw "Positional format specifier must have position of at least 1";
                count_pos = std::max(count_pos, maybe_num);
                if (++it >= str.end()) throw "Format specifier incorrectly terminated by end of string";
            } else {
                // Non-positional specifier, like %s
                ++count_normal;
                ++it;
            }
            // The remainder "[flags][width][.precision][length]type" of the
            // specifier is not checked. Parsing continues with the next '%'.
        }
        if (count_normal && count_pos) throw "Format specifiers must be all positional or all non-positional!";
        unsigned count{count_normal | count_pos};
        if (num_params != count) throw "Format specifier count must match the argument count!";
    }